

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
 __thiscall kj::anon_unknown_36::HttpInputStreamImpl::readRequestHeaders(HttpInputStreamImpl *this)

{
  Coroutine<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  *this_00;
  HttpHeaders *this_01;
  HttpInputStreamImpl *this_02;
  PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr__;
  uint uVar1;
  PromiseArenaMember *node;
  undefined8 uVar2;
  SourceLocation location;
  bool bVar3;
  coroutine_handle<void> coroutine;
  undefined8 *puVar4;
  StringPtr *header;
  undefined8 *puVar5;
  long lVar6;
  long in_RSI;
  FixVoid<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  *value;
  FixVoid<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr___00;
  
  coroutine._M_fr_ptr = operator_new(0x588);
  *(code **)coroutine._M_fr_ptr = readRequestHeaders;
  *(code **)((long)coroutine._M_fr_ptr + 8) = readRequestHeaders;
  this_00 = (Coroutine<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
             *)((long)coroutine._M_fr_ptr + 0x10);
  *(long *)((long)coroutine._M_fr_ptr + 0x578) = in_RSI;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006da5a0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006da5e8;
  location.function = "readRequestHeaders";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x62c;
  location.columnNumber = 0x42;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006da5a0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006da5e8;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)this_00;
  if (*(char *)(in_RSI + 0xa8) == '\x01') {
    value = (FixVoid<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
             *)((long)coroutine._M_fr_ptr + 0x470);
    __return_storage_ptr___00 =
         (FixVoid<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
          *)(in_RSI + 0xb0);
    if (__return_storage_ptr___00->tag == 2) {
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0x470) = 2;
      uVar2 = *(undefined8 *)(in_RSI + 0xc0);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x478) = *(undefined8 *)(in_RSI + 0xb8);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x480) = uVar2;
    }
    else if (__return_storage_ptr___00->tag == 1) {
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0x470) = 1;
      uVar2 = *(undefined8 *)(in_RSI + 0xc0);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x478) = *(undefined8 *)(in_RSI + 0xb8);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x480) = uVar2;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x488) = *(undefined8 *)(in_RSI + 200);
    }
    kj::_::
    Coroutine<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
    ::fulfill(this_00,value);
    if (value->tag - 1 < 3) {
      value->tag = 0;
    }
    if ((*(char *)(in_RSI + 0xa8) != '\x01') ||
       (*(undefined1 *)(in_RSI + 0xa8) = 0, 1 < *(int *)(in_RSI + 0xb0) - 1U)) goto LAB_003f16d0;
  }
  else {
    this_02 = (HttpInputStreamImpl *)((long)coroutine._M_fr_ptr + 0x570);
    readMessageHeaders(this_02);
    __return_storage_ptr__ =
         (PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)
         ((long)coroutine._M_fr_ptr + 0x278);
    co_await<kj::OneOf<kj::ArrayPtr<char>,kj::HttpHeaders::ProtocolError>>
              (__return_storage_ptr__,
               (Promise<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)this_02);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x580) = 0;
    bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
    if (bVar3) {
      return (PromiseBase)(PromiseBase)this;
    }
    kj::_::PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::
    await_resume((OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *)
                 ((long)coroutine._M_fr_ptr + 0x4b0),__return_storage_ptr__);
    if ((*(char *)((long)coroutine._M_fr_ptr + 0x428) == '\x01') &&
       (*(int *)((long)coroutine._M_fr_ptr + 0x430) - 1U < 2)) {
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0x430) = 0;
    }
    if (*(char *)((long)coroutine._M_fr_ptr + 0x290) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x298));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
    node = (PromiseArenaMember *)(this_02->super_HttpInputStream)._vptr_HttpInputStream;
    if (node != (PromiseArenaMember *)0x0) {
      (this_02->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose(node);
    }
    uVar1 = ((OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *)
            ((long)coroutine._M_fr_ptr + 0x4b0))->tag;
    if (uVar1 == 1) {
      __return_storage_ptr___00 =
           (FixVoid<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
            *)((long)coroutine._M_fr_ptr + 0x530);
      lVar6 = *(long *)((long)coroutine._M_fr_ptr + 0x578);
      this_01 = (HttpHeaders *)(lVar6 + 0x48);
      if (*(long *)(lVar6 + 0x58) != 0) {
        puVar5 = *(undefined8 **)(lVar6 + 0x50);
        puVar4 = puVar5 + *(long *)(lVar6 + 0x58) * 2;
        do {
          *puVar5 = "";
          puVar5[1] = 1;
          puVar5 = puVar5 + 2;
        } while (puVar5 != puVar4);
        lVar6 = *(long *)((long)coroutine._M_fr_ptr + 0x578);
      }
      *(undefined8 *)(lVar6 + 0x70) = *(undefined8 *)(lVar6 + 0x68);
      HttpHeaders::tryParseRequestOrConnect
                (__return_storage_ptr___00,this_01,
                 *(ArrayPtr<char> *)((long)coroutine._M_fr_ptr + 0x4b8));
      kj::_::
      Coroutine<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
      ::fulfill(this_00,__return_storage_ptr___00);
    }
    else {
      if (uVar1 != 2) {
        kj::_::unreachable();
      }
      __return_storage_ptr___00 =
           (FixVoid<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
            *)((long)coroutine._M_fr_ptr + 0x4f0);
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0x4f0) = 3;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4f8) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4b8);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x500) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4c0);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x508) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4c8);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x510) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4d0);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x518) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4d8);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x520) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4e0);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x528) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4e8);
      kj::_::
      Coroutine<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
      ::fulfill(this_00,__return_storage_ptr___00);
    }
    if (2 < __return_storage_ptr___00->tag - 1) goto LAB_003f16d0;
  }
  __return_storage_ptr___00->tag = 0;
LAB_003f16d0:
  *(undefined8 *)coroutine._M_fr_ptr = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x580) = 1;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

inline kj::Promise<HttpHeaders::RequestConnectOrProtocolError> readRequestHeaders() {
    KJ_IF_SOME(resuming, resumingRequest) {
      KJ_DEFER(resumingRequest = kj::none);
      co_return HttpHeaders::RequestConnectOrProtocolError(resuming);
    }

    auto textOrError = co_await readMessageHeaders();
    KJ_SWITCH_ONEOF(textOrError) {
      KJ_CASE_ONEOF(protocolError, HttpHeaders::ProtocolError) {
        co_return protocolError;
      }
      KJ_CASE_ONEOF(text, kj::ArrayPtr<char>) {
        headers.clear();
        co_return headers.tryParseRequestOrConnect(text);
      }
    }

    KJ_UNREACHABLE;
  }